

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_parse_url_path(connectdata *conn)

{
  int *piVar1;
  curl_ftpfile cVar2;
  char *pcVar3;
  ftp_conn *pfVar4;
  SessionHandle *pSVar5;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  char **ppcVar10;
  char *pcVar11;
  char *pcVar12;
  CURLcode CVar13;
  void *pvVar14;
  ftp_conn *ftpc;
  size_t uznum;
  SessionHandle *pSVar15;
  ulong uVar16;
  SessionHandle *pSVar17;
  int dlen;
  int local_4c;
  ftp_conn *local_48;
  SessionHandle *local_40;
  void *local_38;
  
  pSVar15 = conn->data;
  pvVar14 = (pSVar15->req).protop;
  ftpc = (ftp_conn *)&conn->proto;
  pcVar12 = (pSVar15->state).path;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  cVar2 = (pSVar15->set).ftp_filemethod;
  pSVar17 = pSVar15;
  if (cVar2 == FTPFILE_SINGLECWD) {
    if (*pcVar12 == '\0') {
      (conn->proto).ftpc.dirdepth = 0;
      goto LAB_00492e55;
    }
    pcVar11 = strrchr(pcVar12,0x2f);
    if (pcVar11 == (char *)0x0) goto LAB_00492e86;
    local_38 = pvVar14;
    ppcVar10 = (char **)(*Curl_ccalloc)(1,8);
    (conn->proto).ftpc.dirs = ppcVar10;
    if (ppcVar10 == (char **)0x0) goto LAB_00493156;
    uznum = (long)pcVar11 - (long)pcVar12;
    if (uznum == 0) {
      uznum = 1;
    }
    pSVar15 = conn->data;
    iVar7 = curlx_uztosi(uznum);
    pcVar12 = curl_easy_unescape(pSVar15,pcVar12,iVar7,(int *)0x0);
    *(conn->proto).ftpc.dirs = pcVar12;
    if (*(conn->proto).ftpc.dirs != (char *)0x0) {
      (conn->proto).ftpc.dirdepth = 1;
      pcVar12 = pcVar11 + 1;
      pvVar14 = local_38;
      goto LAB_00492e3e;
    }
LAB_00493151:
    freedirs(ftpc);
LAB_00493156:
    CVar13 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (cVar2 == FTPFILE_NOCWD) {
      if (((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) ||
         (sVar9 = strlen(pcVar12), pcVar12[sVar9 - 1] == '/')) goto LAB_00492e55;
    }
    else {
      (conn->proto).pop3c.strip = 0x500000000;
      ppcVar10 = (char **)(*Curl_ccalloc)(5,8);
      (conn->proto).ftpc.dirs = ppcVar10;
      if (ppcVar10 == (char **)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar7 = curl_strequal(pcVar12,"/");
      if (iVar7 == 0) {
        pcVar11 = strchr(pcVar12,0x2f);
        pfVar4 = ftpc;
        pSVar5 = pSVar15;
        if (pcVar11 == (char *)0x0) {
          if (pcVar12 == (char *)0x0) goto LAB_00492e55;
        }
        else {
          do {
            local_40 = pSVar5;
            local_48 = pfVar4;
            pSVar17 = local_40;
            pcVar3 = (pSVar15->state).path;
            uVar16 = 0;
            if (pcVar12 != pcVar3 && -1 < (long)pcVar12 - (long)pcVar3) {
              uVar16 = (ulong)((conn->proto).ftpc.dirdepth == 0);
            }
            if ((long)pcVar11 - (long)pcVar12 == 0) {
              if ((conn->proto).ftpc.dirdepth == 0) {
                pcVar12 = (*Curl_cstrdup)("/");
                iVar7 = (conn->proto).ftpc.dirdepth;
                (conn->proto).ftpc.dirs[iVar7] = pcVar12;
                (conn->proto).ftpc.dirdepth = iVar7 + 1;
                if ((conn->proto).ftpc.dirs[iVar7] == (char *)0x0) {
                  Curl_failf(pSVar17,"no memory");
                  goto LAB_00493151;
                }
              }
            }
            else {
              iVar7 = curlx_sztosi(((long)pcVar11 - (long)pcVar12) + uVar16);
              pcVar12 = curl_easy_unescape(conn->data,pcVar12 + -uVar16,iVar7,(int *)0x0);
              iVar7 = (conn->proto).ftpc.dirdepth;
              (conn->proto).ftpc.dirs[iVar7] = pcVar12;
              ppcVar10 = (conn->proto).ftpc.dirs;
              pcVar12 = ppcVar10[iVar7];
              if (pcVar12 == (char *)0x0) {
                Curl_failf(local_40,"no memory");
                ftpc = local_48;
                goto LAB_00493151;
              }
              _Var6 = isBadFtpString(pcVar12);
              pSVar17 = local_40;
              ftpc = local_48;
              if (_Var6) {
                (*Curl_cfree)(pcVar12);
                ftpc = local_48;
                goto LAB_00492eb1;
              }
              (conn->proto).ftpc.dirdepth = iVar7 + 1;
              iVar8 = (conn->proto).ftpc.diralloc;
              if (iVar8 <= iVar7 + 1) {
                (conn->proto).ftpc.diralloc = iVar8 * 2;
                ppcVar10 = (char **)(*Curl_crealloc)(ppcVar10,(long)iVar8 << 4);
                if (ppcVar10 == (char **)0x0) goto LAB_00493151;
                (conn->proto).ftpc.dirs = ppcVar10;
              }
            }
            pcVar12 = pcVar11 + 1;
            pcVar11 = strchr(pcVar12,0x2f);
            pSVar15 = pSVar17;
            pfVar4 = local_48;
            pSVar5 = local_40;
          } while (pcVar11 != (char *)0x0);
        }
      }
      else {
        pcVar12 = pcVar12 + 1;
        pcVar11 = (*Curl_cstrdup)("/");
        *(conn->proto).ftpc.dirs = pcVar11;
        piVar1 = &(conn->proto).ftpc.dirdepth;
        *piVar1 = *piVar1 + 1;
      }
    }
LAB_00492e3e:
    pSVar15 = pSVar17;
    if (*pcVar12 == '\0') {
LAB_00492e55:
      (conn->proto).ftpc.file = (char *)0x0;
      pSVar17 = pSVar15;
      if (((pSVar15->set).upload != true) || (*(int *)((long)pvVar14 + 0x18) != 0)) {
LAB_00492ec0:
        (conn->proto).ftpc.cwddone = false;
        if ((conn->proto).ftpc.prevpath == (char *)0x0) {
          return CURLE_OK;
        }
        iVar7 = 0;
        pcVar12 = curl_easy_unescape(conn->data,(pSVar17->state).path,0,&local_4c);
        if (pcVar12 != (char *)0x0) {
          pcVar11 = (conn->proto).ftpc.file;
          if (pcVar11 != (char *)0x0) {
            sVar9 = strlen(pcVar11);
            iVar7 = curlx_uztosi(sVar9);
          }
          iVar7 = local_4c - iVar7;
          local_4c = iVar7;
          sVar9 = strlen((conn->proto).ftpc.prevpath);
          iVar8 = curlx_uztosi(sVar9);
          if ((iVar7 == iVar8) &&
             (iVar7 = curl_strnequal(pcVar12,(conn->proto).ftpc.prevpath,(long)local_4c), iVar7 != 0
             )) {
            Curl_infof(pSVar17,"Request has same path as previous transfer\n");
            (conn->proto).ftpc.cwddone = true;
          }
          (*Curl_cfree)(pcVar12);
          return CURLE_OK;
        }
        goto LAB_00493151;
      }
      Curl_failf(pSVar15,"Uploading to a URL without a file name!");
    }
    else {
      pSVar15 = conn->data;
LAB_00492e86:
      pcVar12 = curl_easy_unescape(pSVar15,pcVar12,0,(int *)0x0);
      (conn->proto).ftpc.file = pcVar12;
      if (pcVar12 == (char *)0x0) {
        freedirs(ftpc);
        Curl_failf(pSVar17,"no memory");
        goto LAB_00493156;
      }
      _Var6 = isBadFtpString(pcVar12);
      if (!_Var6) goto LAB_00492ec0;
LAB_00492eb1:
      freedirs(ftpc);
    }
    CVar13 = CURLE_URL_MALFORMAT;
  }
  return CVar13;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slash_pos;  /* position of the first '/' char in curpos */
  const char *path_to_use = data->state.path;
  const char *cur_pos;
  const char *filename = NULL;

  cur_pos = path_to_use; /* current position in path. point at the begin
                            of next path component */

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  switch(data->set.ftp_filemethod) {
  case FTPFILE_NOCWD:
    /* fastest, but less standard-compliant */

    /*
      The best time to check whether the path is a file or directory is right
      here. so:

      the first condition in the if() right here, is there just in case
      someone decides to set path to NULL one day
   */
    if(data->state.path &&
       data->state.path[0] &&
       (data->state.path[strlen(data->state.path) - 1] != '/') )
      filename = data->state.path;  /* this is a full file path */
      /*
        ftpc->file is not used anywhere other than for operations on a file.
        In other words, never for directory operations.
        So we can safely leave filename as NULL here and use it as a
        argument in dir/file decisions.
      */
    break;

  case FTPFILE_SINGLECWD:
    /* get the last slash */
    if(!path_to_use[0]) {
      /* no dir, no file */
      ftpc->dirdepth = 0;
      break;
    }
    slash_pos=strrchr(cur_pos, '/');
    if(slash_pos || !*cur_pos) {
      size_t dirlen = slash_pos-cur_pos;

      ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
      if(!ftpc->dirs)
        return CURLE_OUT_OF_MEMORY;

      if(!dirlen)
        dirlen++;

      ftpc->dirs[0] = curl_easy_unescape(conn->data, slash_pos ? cur_pos : "/",
                                         slash_pos ? curlx_uztosi(dirlen) : 1,
                                         NULL);
      if(!ftpc->dirs[0]) {
        freedirs(ftpc);
        return CURLE_OUT_OF_MEMORY;
      }
      ftpc->dirdepth = 1; /* we consider it to be a single dir */
      filename = slash_pos ? slash_pos+1 : cur_pos; /* rest is file name */
    }
    else
      filename = cur_pos;  /* this is a file name only */
    break;

  default: /* allow pretty much anything */
  case FTPFILE_MULTICWD:
    ftpc->dirdepth = 0;
    ftpc->diralloc = 5; /* default dir depth to allocate */
    ftpc->dirs = calloc(ftpc->diralloc, sizeof(ftpc->dirs[0]));
    if(!ftpc->dirs)
      return CURLE_OUT_OF_MEMORY;

    /* we have a special case for listing the root dir only */
    if(strequal(path_to_use, "/")) {
      cur_pos++; /* make it point to the zero byte */
      ftpc->dirs[0] = strdup("/");
      ftpc->dirdepth++;
    }
    else {
      /* parse the URL path into separate path components */
      while((slash_pos = strchr(cur_pos, '/')) != NULL) {
        /* 1 or 0 pointer offset to indicate absolute directory */
        ssize_t absolute_dir = ((cur_pos - data->state.path > 0) &&
                                (ftpc->dirdepth == 0))?1:0;

        /* seek out the next path component */
        if(slash_pos-cur_pos) {
          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          int len = curlx_sztosi(slash_pos - cur_pos + absolute_dir);
          ftpc->dirs[ftpc->dirdepth] =
            curl_easy_unescape(conn->data, cur_pos - absolute_dir, len, NULL);
          if(!ftpc->dirs[ftpc->dirdepth]) { /* run out of memory ... */
            failf(data, "no memory");
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          if(isBadFtpString(ftpc->dirs[ftpc->dirdepth])) {
            free(ftpc->dirs[ftpc->dirdepth]);
            freedirs(ftpc);
            return CURLE_URL_MALFORMAT;
          }
        }
        else {
          cur_pos = slash_pos + 1; /* jump to the rest of the string */
          if(!ftpc->dirdepth) {
            /* path starts with a slash, add that as a directory */
            ftpc->dirs[ftpc->dirdepth] = strdup("/");
            if(!ftpc->dirs[ftpc->dirdepth++]) { /* run out of memory ... */
              failf(data, "no memory");
              freedirs(ftpc);
              return CURLE_OUT_OF_MEMORY;
            }
          }
          continue;
        }

        cur_pos = slash_pos + 1; /* jump to the rest of the string */
        if(++ftpc->dirdepth >= ftpc->diralloc) {
          /* enlarge array */
          char **bigger;
          ftpc->diralloc *= 2; /* double the size each time */
          bigger = realloc(ftpc->dirs, ftpc->diralloc * sizeof(ftpc->dirs[0]));
          if(!bigger) {
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          ftpc->dirs = bigger;
        }
      }
    }
    filename = cur_pos;  /* the rest is the file name */
    break;
  } /* switch */

  if(filename && *filename) {
    ftpc->file = curl_easy_unescape(conn->data, filename, 0, NULL);
    if(NULL == ftpc->file) {
      freedirs(ftpc);
      failf(data, "no memory");
      return CURLE_OUT_OF_MEMORY;
    }
    if(isBadFtpString(ftpc->file)) {
      freedirs(ftpc);
      return CURLE_URL_MALFORMAT;
    }
  }
  else
    ftpc->file=NULL; /* instead of point to a zero byte, we make it a NULL
                       pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if(ftpc->prevpath) {
    /* prevpath is "raw" so we convert the input path before we compare the
       strings */
    int dlen;
    char *path = curl_easy_unescape(conn->data, data->state.path, 0, &dlen);
    if(!path) {
      freedirs(ftpc);
      return CURLE_OUT_OF_MEMORY;
    }

    dlen -= ftpc->file?curlx_uztosi(strlen(ftpc->file)):0;
    if((dlen == curlx_uztosi(strlen(ftpc->prevpath))) &&
       strnequal(path, ftpc->prevpath, dlen)) {
      infof(data, "Request has same path as previous transfer\n");
      ftpc->cwddone = TRUE;
    }
    free(path);
  }

  return CURLE_OK;
}